

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAsciiHexDecodeStream.cpp
# Opt level: O1

void __thiscall InputAsciiHexDecodeStream::ReadNextBuffer(InputAsciiHexDecodeStream *this)

{
  int iVar1;
  int iVar2;
  Byte aByte;
  Byte buffer [2];
  byte local_1b;
  byte local_1a [2];
  
  local_1b = 0;
  iVar2 = 0;
  do {
    iVar1 = (*this->mSourceStream->_vptr_IByteReader[3])();
    if ((char)iVar1 == '\0') break;
    (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,&local_1b,1);
    if ((byte)(local_1b - 0x21) < 0x55) {
      local_1a[iVar2] = local_1b;
      iVar2 = iVar2 + 1;
    }
    else if (local_1b == 0x7e) {
      (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,&local_1b,1);
      if (local_1b == 0x3e) {
        this->mHitEnd = true;
        break;
      }
    }
    else if (local_1b == 0x7a) {
      local_1a[iVar2] = 0x7a;
      iVar2 = iVar2 + 1;
      break;
    }
  } while (iVar2 < 2);
  if (0 < iVar2) {
    if (local_1a[0] == 0x7a) {
      this->mBuffer[0] = '\0';
      this->mBuffer[1] = '\0';
      this->mBuffer[2] = '\0';
      this->mBuffer[3] = '\0';
      this->mReadBufferSize = 4;
      this->mReadBufferIndex = 0;
    }
    else {
      if ((byte)(local_1a[0] - 0x30) < 10) {
        iVar1 = (uint)local_1a[0] * 0x10 + -0x300;
      }
      else if ((byte)(local_1a[0] + 0xbf) < 6) {
        iVar1 = (uint)local_1a[0] * 0x10 + -0x370;
      }
      else {
        iVar1 = 0;
        if ((byte)(local_1a[0] + 0x9f) < 6) {
          iVar1 = (uint)local_1a[0] * 0x10 + -0x570;
        }
      }
      if ((byte)(local_1a[1] - 0x30) < 10) {
        iVar1 = iVar1 + (uint)local_1a[1] + -0x30;
      }
      else if ((byte)(local_1a[1] + 0xbf) < 6) {
        iVar1 = iVar1 + (uint)local_1a[1] + -0x37;
      }
      else if ((byte)(local_1a[1] + 0x9f) < 6) {
        iVar1 = iVar1 + (uint)local_1a[1] + -0x57;
      }
      *(int *)this->mBuffer = iVar1;
      this->mReadBufferIndex = 0;
      this->mReadBufferSize = iVar2 + -1;
    }
  }
  return;
}

Assistant:

void InputAsciiHexDecodeStream::ReadNextBuffer()
{
	Byte buffer[2];
	Byte aByte = 0;
	int readIndex = 0;
	
	while(readIndex < 2 && mSourceStream->NotEnded())
	{
		mSourceStream->Read(&aByte,1);

		if(33 <= aByte && aByte<= 117)
		{
			buffer[readIndex] = aByte;
			++readIndex;
		}
		else if(aByte == 122)
		{
			// z - special case
			buffer[readIndex] = aByte;
			++readIndex;
			break;
		}
		else if(aByte == 126)
		{
			// EOD marker
			mSourceStream->Read(&aByte,1);
			if(aByte == 62)
			{
				mHitEnd = true;
				break;
			}
		}
		// else, continue to next character, skipping space and invalid

	}

	// if there's anything to decode
	if(readIndex > 0)
	{
		if(buffer[0] == 122)
		{
			// special case Z
			mBuffer[0] = mBuffer[1] = mBuffer[2] = mBuffer[3] = 0;
			mReadBufferIndex = 0;
			mReadBufferSize = 4;
		}
		else
		{
			unsigned long encodedValue = 0;

			if (buffer[0] >= '0' && buffer[0] <= '9') {
				encodedValue = (buffer[0] - '0') << 4;
			}
			else if (buffer[0] >= 'A' && buffer[0] <= 'F') {
				encodedValue = (buffer[0] - 'A' + 10) << 4;
			}
			else if (buffer[0] >= 'a' && buffer[0] <= 'f') {
				encodedValue = (buffer[0] - 'a' + 10) << 4;
			}

			if (buffer[1] >= '0' && buffer[1] <= '9') {
				encodedValue += buffer[1] - '0';
			}
			else if (buffer[1] >= 'A' && buffer[1] <= 'F') {
				encodedValue += buffer[1] - 'A' + 10;
			}
			else if (buffer[1] >= 'a' && buffer[1] <= 'f') {
				encodedValue += buffer[1] - 'a' + 10;
			}

			memcpy(mBuffer, &encodedValue,4);
			mReadBufferIndex = 0;
			mReadBufferSize = readIndex-1;
		}

	}
}